

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::imgfsheader::imgfsheader(imgfsheader *this,ReadWriter_ptr *rd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  element_type *peVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  string *__return_storage_ptr__;
  string local_38;
  ReadWriter_ptr *local_18;
  ReadWriter_ptr *rd_local;
  imgfsheader *this_local;
  
  local_18 = rd;
  rd_local = (ReadWriter_ptr *)this;
  peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  (*peVar7->_vptr_ReadWriter[4])(peVar7,0x1c);
  peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar6 = ReadWriter::read32le(peVar7);
  this->direntsize = uVar6;
  peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar6 = ReadWriter::read32le(peVar7);
  this->chunksperblock = uVar6;
  peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar6 = ReadWriter::read32le(peVar7);
  this->bytesperblock = uVar6;
  peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  ReadWriter::read32le(peVar7);
  peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar6 = ReadWriter::read32le(peVar7);
  this->compressiontype = uVar6;
  peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar6 = ReadWriter::read32le(peVar7);
  this->freesectorcount = uVar6;
  peVar7 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  uVar6 = ReadWriter::read32le(peVar7);
  this->hiddensectorcount = uVar6;
  this->bytesperchunk = this->bytesperblock / this->chunksperblock;
  this->entriesperblock = (this->bytesperblock - 8) / this->direntsize;
  if (this->direntsize != 0x34) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = "unsupported direntsize";
    __cxa_throw(puVar8,&char_const*::typeinfo,0);
  }
  if (g_verbose != 0) {
    uVar1 = this->direntsize;
    uVar2 = this->chunksperblock;
    uVar3 = this->bytesperblock;
    uVar4 = this->bytesperchunk;
    uVar5 = this->entriesperblock;
    __return_storage_ptr__ = &local_38;
    getstr<unsigned_char_const*>(__return_storage_ptr__,(uchar *)&this->compressiontype,4);
    uVar9 = std::__cxx11::string::c_str();
    printf("imgfshdr: dirent=%d, cpb=%d, bpb=%d bpc=%d, epb= %d, comp=%s free=%d, hidden=%d\n",
           (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,uVar9,
           this->freesectorcount,this->hiddensectorcount,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

imgfsheader(ReadWriter_ptr rd)
        {
            // 00: f8 ac 2c 9d e3 d4 2b 4d bd 30 91 6e d8 4f 31 dc

            // 0x10 : 1
            // 0x14 : 1
            // 0x18 : 1
            rd->setpos(0x1c);
            direntsize= rd->read32le(); // 0x1c : 0x34
            chunksperblock= rd->read32le(); // 0x20 : 0x20
            bytesperblock= rd->read32le(); // 0x24 : 0x800
            rd->read32le(); // 0x28 : 0x1000
            compressiontype= rd->read32le(); // 0x2c
            freesectorcount= rd->read32le(); // 0x30
            hiddensectorcount= rd->read32le(); // 0x34 : 0x40

            bytesperchunk= bytesperblock/chunksperblock;
            entriesperblock= (bytesperblock-8)/direntsize;
            if (direntsize!=0x34)
                throw "unsupported direntsize";

            if (g_verbose) { 
                printf("imgfshdr: dirent=%d, cpb=%d, bpb=%d bpc=%d, epb= %d, comp=%s free=%d, hidden=%d\n", 
                    direntsize, chunksperblock, bytesperblock, bytesperchunk, entriesperblock, getstr((const uint8_t*)&compressiontype, 4).c_str(), freesectorcount, hiddensectorcount);
            }
        }